

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  anon_union_48_1_493b367e_for_ServiceDescriptorProto_3 aVar4;
  uint uVar5;
  Rep *pRVar6;
  size_t sVar7;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *this_00;
  size_t sVar8;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *pRVar9;
  
  sVar8 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.method_;
  pRVar9 = this_00;
  if ((undefined1  [48])((undefined1  [48])this->field_0 & (undefined1  [48])0x1) !=
      (undefined1  [48])0x0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)pRVar6->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)pRVar6->elements;
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar9 != (RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar9 = (RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)
               &(pRVar9->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = MethodDescriptorProto::ByteSizeLong
                      ((MethodDescriptorProto *)
                       (pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar5 = (uint)sVar7 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar8 = sVar8 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  aVar4 = this->field_0;
  if (((undefined1  [48])aVar4 & (undefined1  [48])0x3) != (undefined1  [48])0x0) {
    if (((undefined1  [48])aVar4 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                       + 8);
      uVar5 = (uint)lVar2 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar8 = sVar8 + lVar2 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [48])aVar4 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
      sVar7 = ServiceOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar5 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar8 = sVar8 + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar8 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar8,&(this->field_0)._impl_._cached_size_);
  return sVar8;
}

Assistant:

::size_t ServiceDescriptorProto::ByteSizeLong() const {
  const ServiceDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.MethodDescriptorProto method = 2;
    {
      total_size += 1UL * this_._internal_method_size();
      for (const auto& msg : this_._internal_method()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.ServiceOptions options = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}